

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int compare_rd_idx_pair(void *a,void *b)

{
  void *b_local;
  void *a_local;
  undefined4 local_4;
  
  if (*(long *)((long)a + 8) == *(long *)((long)b + 8)) {
    if (*a == *b) {
      local_4 = 0;
    }
    else if (*b < *a) {
      local_4 = 1;
    }
    else {
      local_4 = -1;
    }
  }
  else if (*(long *)((long)b + 8) < *(long *)((long)a + 8)) {
    local_4 = 1;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int compare_rd_idx_pair(const void *a, const void *b) {
  if (((RdIdxPair *)a)->rd == ((RdIdxPair *)b)->rd) {
    // To avoid inconsistency in qsort() ordering when two elements are equal,
    // using idx as tie breaker. Refer aomedia:2928
    if (((RdIdxPair *)a)->idx == ((RdIdxPair *)b)->idx)
      return 0;
    else if (((RdIdxPair *)a)->idx > ((RdIdxPair *)b)->idx)
      return 1;
    else
      return -1;
  } else if (((const RdIdxPair *)a)->rd > ((const RdIdxPair *)b)->rd) {
    return 1;
  } else {
    return -1;
  }
}